

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImDrawCmd *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pIVar2 = (this->CmdBuffer).Data;
  iVar1 = (this->CmdBuffer).Size;
  pIVar6 = pIVar2 + (long)iVar1 + -1;
  if (pIVar2[(long)iVar1 + -1].ElemCount == 0) {
    if (1 < iVar1) {
      auVar9[0] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.x ==
                   *(char *)&(this->_CmdHeader).ClipRect.x);
      auVar9[1] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 1) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1));
      auVar9[2] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 2) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2));
      auVar9[3] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 3) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3));
      auVar9[4] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.y ==
                   *(char *)&(this->_CmdHeader).ClipRect.y);
      auVar9[5] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 1) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1));
      auVar9[6] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 2) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2));
      auVar9[7] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 3) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3));
      auVar9[8] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.z ==
                   *(char *)&(this->_CmdHeader).ClipRect.z);
      auVar9[9] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 1) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1));
      auVar9[10] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2));
      auVar9[0xb] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 3) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3));
      auVar9[0xc] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.w ==
                     *(char *)&(this->_CmdHeader).ClipRect.w);
      auVar9[0xd] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 1) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1));
      auVar9[0xe] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 2) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2));
      auVar9[0xf] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 3) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3));
      auVar7[0] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.w ==
                   *(char *)&(this->_CmdHeader).ClipRect.w);
      auVar7[1] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 1) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1));
      auVar7[2] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 2) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2));
      auVar7[3] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 3) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3));
      auVar7[4] = -(*(char *)&pIVar2[(long)iVar1 + -2].TextureId ==
                   *(char *)&(this->_CmdHeader).TextureId);
      auVar7[5] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 1) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 1));
      auVar7[6] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 2) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 2));
      auVar7[7] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 3) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 3));
      auVar7[8] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 4) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 4));
      auVar7[9] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 5) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 5));
      auVar7[10] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 6) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 6));
      auVar7[0xb] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 7) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 7));
      auVar7[0xc] = -((char)pIVar2[(long)iVar1 + -2].VtxOffset == (char)(this->_CmdHeader).VtxOffset
                     );
      auVar7[0xd] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 1) ==
                     *(char *)((long)&(this->_CmdHeader).VtxOffset + 1));
      auVar7[0xe] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 2) ==
                     *(char *)((long)&(this->_CmdHeader).VtxOffset + 2));
      auVar7[0xf] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 3) ==
                     *(char *)((long)&(this->_CmdHeader).VtxOffset + 3));
      auVar7 = auVar7 & auVar9;
      if ((((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) &&
          (pIVar2[(long)iVar1 + -2].ElemCount + pIVar2[(long)iVar1 + -2].IdxOffset ==
           pIVar2[(long)iVar1 + -1].IdxOffset)) &&
         (pIVar2[(long)iVar1 + -2].UserCallback == (ImDrawCallback)0x0)) {
        (this->CmdBuffer).Size = iVar1 + -1;
        return;
      }
    }
  }
  else {
    auVar8[0] = -(*(char *)&(this->_CmdHeader).ClipRect.x == *(char *)&(pIVar6->ClipRect).x);
    auVar8[1] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 1) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.x + 1));
    auVar8[2] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 2) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.x + 2));
    auVar8[3] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 3) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.x + 3));
    auVar8[4] = -(*(char *)&(this->_CmdHeader).ClipRect.y ==
                 *(char *)&pIVar2[(long)iVar1 + -1].ClipRect.y);
    auVar8[5] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 1) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.y + 1));
    auVar8[6] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 2) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.y + 2));
    auVar8[7] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 3) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.y + 3));
    auVar8[8] = -(*(char *)&(this->_CmdHeader).ClipRect.z ==
                 *(char *)&pIVar2[(long)iVar1 + -1].ClipRect.z);
    auVar8[9] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 1) ==
                 *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.z + 1));
    auVar8[10] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 2) ==
                  *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.z + 2));
    auVar8[0xb] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 3) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.z + 3));
    auVar8[0xc] = -(*(char *)&(this->_CmdHeader).ClipRect.w ==
                   *(char *)&pIVar2[(long)iVar1 + -1].ClipRect.w);
    auVar8[0xd] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 1) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.w + 1));
    auVar8[0xe] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 2) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.w + 2));
    auVar8[0xf] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 3) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.w + 3));
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) {
      AddDrawCmd(this);
      return;
    }
  }
  fVar3 = (this->_CmdHeader).ClipRect.y;
  fVar4 = (this->_CmdHeader).ClipRect.z;
  fVar5 = (this->_CmdHeader).ClipRect.w;
  (pIVar6->ClipRect).x = (this->_CmdHeader).ClipRect.x;
  (pIVar6->ClipRect).y = fVar3;
  pIVar2[(long)iVar1 + -1].ClipRect.z = fVar4;
  pIVar2[(long)iVar1 + -1].ClipRect.w = fVar5;
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && ImDrawCmd_AreSequentialIdxOffset(prev_cmd, curr_cmd) && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}